

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

bool P_ClipLineToPortal(line_t_conflict *line,line_t_conflict *portal,DVector2 *view,bool partial,
                       bool samebehind)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  DVector2 local_38;
  
  local_38.X = (line->v1->p).X;
  local_38.Y = (line->v1->p).Y;
  uVar4 = P_GetLineSide(&local_38,portal);
  local_38.X = (line->v2->p).X;
  local_38.Y = (line->v2->p).Y;
  uVar5 = P_GetLineSide(&local_38,portal);
  bVar3 = true;
  if (uVar5 != 0 || uVar4 != 0) {
    uVar1 = uVar4;
    if (uVar4 == 0) {
      uVar1 = uVar5;
    }
    if (uVar5 == 0) {
      uVar5 = uVar4;
      uVar1 = uVar4;
    }
    if ((int)uVar1 < 1 || (int)uVar5 < 1) {
      if ((int)(uVar1 & uVar5) < 0) {
        bVar3 = false;
      }
      else {
        iVar6 = P_GetLineSide(view,line);
        local_38.X = (portal->v1->p).X;
        local_38.Y = (portal->v1->p).Y;
        iVar7 = P_GetLineSide(&local_38,line);
        local_38.X = (portal->v2->p).X;
        local_38.Y = (portal->v2->p).Y;
        iVar8 = P_GetLineSide(&local_38,line);
        iVar2 = iVar7;
        if (iVar7 == 0) {
          iVar2 = iVar8;
        }
        bVar3 = iVar6 != iVar2 && ((iVar8 == iVar7 || iVar8 == 0) || iVar7 == 0);
      }
    }
  }
  return bVar3;
}

Assistant:

bool P_ClipLineToPortal(line_t* line, line_t* portal, DVector2 view, bool partial, bool samebehind)
{
	int behind1 = P_GetLineSide(line->v1->fPos(), portal);
	int behind2 = P_GetLineSide(line->v2->fPos(), portal);

	if (behind1 == 0 && behind2 == 0)
	{
		// The line is parallel to the portal and cannot possibly be visible.
		return true;
	}
	// If one point lies on the same straight line than the portal, the other vertex will determine sidedness alone.
	else if (behind2 == 0) behind2 = behind1;
	else if (behind1 == 0) behind1 = behind2;

	if (behind1 > 0 && behind2 > 0)
	{
		// The line is behind the portal, i.e. between viewer and portal line, and must be rejected
		return true;
	}
	else if (behind1 < 0 && behind2 < 0)
	{
		// The line is in front of the portal, i.e. the portal is between viewer and line. This line must not be rejected
		return false;
	}
	else
	{
		// The line intersects with the portal straight, so we need to do another check to see how both ends of the portal lie in relation to the viewer.
		int viewside = P_GetLineSide(view, line); 
		int p1side = P_GetLineSide(portal->v1->fPos(), line);
		int p2side = P_GetLineSide(portal->v2->fPos(), line);
		// Do the same handling of points on the portal straight as above.
		if (p1side == 0) p1side = p2side;
		else if (p2side == 0) p2side = p1side;
		// If the portal is on the other side of the line than the viewpoint, there is no possibility to see this line inside the portal.
		return (p1side == p2side && viewside != p1side);
	}
}